

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad4d_avx2.c
# Opt level: O3

void aom_sad_skip_64x16x4d_avx2
               (uint8_t *src,int src_stride,uint8_t **ref,int ref_stride,uint32_t *res)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  bool bVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  bool bVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  int iVar13;
  long lVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  
  iVar6 = ref_stride * 2;
  puVar8 = *ref;
  puVar11 = ref[1];
  puVar12 = ref[2];
  puVar9 = ref[3];
  auVar15 = ZEXT1664((undefined1  [16])0x0);
  iVar13 = 0;
  auVar16 = ZEXT1664((undefined1  [16])0x0);
  auVar17 = ZEXT1664((undefined1  [16])0x0);
  auVar18 = ZEXT1664((undefined1  [16])0x0);
  do {
    lVar14 = 0;
    bVar7 = true;
    do {
      bVar10 = bVar7;
      auVar1 = *(undefined1 (*) [32])(src + lVar14);
      auVar3 = vpsadbw_avx2(auVar1,*(undefined1 (*) [32])(puVar8 + lVar14));
      auVar3 = vpaddd_avx2(auVar18._0_32_,auVar3);
      auVar18 = ZEXT3264(auVar3);
      auVar4 = vpsadbw_avx2(auVar1,*(undefined1 (*) [32])(puVar11 + lVar14));
      auVar5 = vpsadbw_avx2(auVar1,*(undefined1 (*) [32])(puVar12 + lVar14));
      auVar4 = vpaddd_avx2(auVar17._0_32_,auVar4);
      auVar17 = ZEXT3264(auVar4);
      auVar5 = vpaddd_avx2(auVar16._0_32_,auVar5);
      auVar16 = ZEXT3264(auVar5);
      auVar1 = vpsadbw_avx2(auVar1,*(undefined1 (*) [32])(puVar9 + lVar14));
      auVar1 = vpaddd_avx2(auVar15._0_32_,auVar1);
      auVar15 = ZEXT3264(auVar1);
      lVar14 = 0x20;
      bVar7 = false;
    } while (bVar10);
    src = src + src_stride * 2;
    puVar8 = puVar8 + iVar6;
    puVar11 = puVar11 + iVar6;
    puVar12 = puVar12 + iVar6;
    puVar9 = puVar9 + iVar6;
    iVar13 = iVar13 + 1;
  } while (iVar13 != 8);
  auVar3 = vshufps_avx(auVar3,auVar4,0x88);
  auVar1 = vshufps_avx(auVar5,auVar1,0x88);
  auVar1 = vphaddd_avx2(auVar3,auVar1);
  auVar2 = vpaddd_avx(auVar1._16_16_,auVar1._0_16_);
  auVar2 = vpaddd_avx(auVar2,auVar2);
  *(undefined1 (*) [16])res = auVar2;
  return;
}

Assistant:

static AOM_FORCE_INLINE void aom_sad16xNx3d_avx2(int N, const uint8_t *src,
                                                 int src_stride,
                                                 const uint8_t *const ref[4],
                                                 int ref_stride,
                                                 uint32_t res[4]) {
  __m256i src_reg, ref0_reg, ref1_reg, ref2_reg;
  __m256i sum_ref0, sum_ref1, sum_ref2;
  const uint8_t *ref0, *ref1, *ref2;
  const __m256i zero = _mm256_setzero_si256();
  assert(N % 2 == 0);

  ref0 = ref[0];
  ref1 = ref[1];
  ref2 = ref[2];
  sum_ref0 = _mm256_setzero_si256();
  sum_ref2 = _mm256_setzero_si256();
  sum_ref1 = _mm256_setzero_si256();

  for (int i = 0; i < N; i += 2) {
    // load src and all refs
    src_reg = yy_loadu2_128(src + src_stride, src);
    ref0_reg = yy_loadu2_128(ref0 + ref_stride, ref0);
    ref1_reg = yy_loadu2_128(ref1 + ref_stride, ref1);
    ref2_reg = yy_loadu2_128(ref2 + ref_stride, ref2);

    // sum of the absolute differences between every ref-i to src
    ref0_reg = _mm256_sad_epu8(ref0_reg, src_reg);
    ref1_reg = _mm256_sad_epu8(ref1_reg, src_reg);
    ref2_reg = _mm256_sad_epu8(ref2_reg, src_reg);

    // sum every ref-i
    sum_ref0 = _mm256_add_epi32(sum_ref0, ref0_reg);
    sum_ref1 = _mm256_add_epi32(sum_ref1, ref1_reg);
    sum_ref2 = _mm256_add_epi32(sum_ref2, ref2_reg);

    src += 2 * src_stride;
    ref0 += 2 * ref_stride;
    ref1 += 2 * ref_stride;
    ref2 += 2 * ref_stride;
  }

  aggregate_and_store_sum(res, &sum_ref0, &sum_ref1, &sum_ref2, &zero);
}